

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char8_t,_char8_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char8_t,_char8_t>_> *this)

{
  _Alloc_hider _Var1;
  undefined8 uVar2;
  int iVar3;
  char32_t (*in_RDX) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char8_t *extraout_RDX_05;
  char8_t *extraout_RDX_06;
  char8_t *extraout_RDX_07;
  char8_t *extraout_RDX_08;
  char8_t *extraout_RDX_09;
  char8_t *extraout_RDX_10;
  char8_t *extraout_RDX_11;
  char8_t *pcVar5;
  _Alloc_hider __s1;
  pointer *__ptr;
  size_type __rlen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer *__ptr_1;
  decode_result dVar6;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> abcd_str;
  AssertHelper local_90 [8];
  long *local_88;
  byte local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  AssertionResult local_70;
  long local_60 [2];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_50;
  
  jessilib::string_cast<char8_t,char32_t[5]>(&local_50,(jessilib *)L"ABCD",in_RDX);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_50._M_string_length;
  __s1._M_p = local_50._M_dataplus._M_p;
  pcVar5 = local_50._M_dataplus._M_p + local_50._M_string_length;
  local_70._0_8_ = local_60;
  std::__cxx11::u8string::_M_construct<char8_t*>
            ((u8string *)&local_70,local_50._M_dataplus._M_p,pcVar5);
  uVar2 = local_70._0_8_;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_50._M_string_length;
  if (((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_50._M_string_length ==
       (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )local_70.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl) &&
     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_50._M_string_length ==
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
      (iVar3 = bcmp(local_50._M_dataplus._M_p,(void *)local_70._0_8_,local_50._M_string_length),
      pbVar4 = extraout_RDX, iVar3 == 0)))) {
    local_80[0] = 1;
  }
  else {
    local_80[0] = 0;
  }
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)uVar2 != local_60) {
    operator_delete((void *)uVar2,local_60[0] + 1);
    pbVar4 = extraout_RDX_00;
  }
  if ((local_80[0] & 1) == 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(char *)local_80,
               "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9d,(char *)local_70._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    pbVar4 = extraout_RDX_01;
    if ((long *)local_70._0_8_ != local_60) {
      operator_delete((void *)local_70._0_8_,local_60[0] + 1);
      pbVar4 = extraout_RDX_02;
    }
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
      pbVar4 = extraout_RDX_03;
    }
  }
  _Var1._M_p = local_50._M_dataplus._M_p;
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    pbVar4 = extraout_RDX_04;
    _Var1._M_p = local_50._M_dataplus._M_p;
  }
  for (; (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_50._M_string_length !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_50._M_string_length = (size_type)(local_50._M_string_length - (long)pbVar4)) {
    in_string._M_str = (char8_t *)pbVar4;
    in_string._M_len = (size_t)_Var1._M_p;
    dVar6 = jessilib::decode_codepoint_utf8<char8_t>
                      ((jessilib *)local_50._M_string_length,in_string);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dVar6.units;
    if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_80[0] = 0;
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(char *)local_80,"is_valid(abcd_str)","false");
      testing::internal::AssertHelper::AssertHelper
                (local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0x9e,(char *)local_70._0_8_);
      testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(local_90);
      if ((long *)local_70._0_8_ != local_60) {
        operator_delete((void *)local_70._0_8_,local_60[0] + 1);
      }
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      break;
    }
    _Var1._M_p = (pointer)(_Var1._M_p + (long)pbVar4);
  }
  local_70._0_8_ = local_60;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_70,__s1._M_p,pcVar5);
  uVar2 = local_70._0_8_;
  pcVar5 = extraout_RDX_05;
  if ((local_70.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl ==
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )this_00) &&
     ((this_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
      (iVar3 = bcmp(__s1._M_p,(void *)local_70._0_8_,(size_t)this_00), pcVar5 = extraout_RDX_06,
      iVar3 == 0)))) {
    local_80[0] = 1;
  }
  else {
    local_80[0] = 0;
  }
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)uVar2 != local_60) {
    operator_delete((void *)uVar2,local_60[0] + 1);
    pcVar5 = extraout_RDX_07;
  }
  if ((local_80[0] & 1) == 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(char *)local_80,
               "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa1,(char *)local_70._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    pcVar5 = extraout_RDX_08;
    if ((long *)local_70._0_8_ != local_60) {
      operator_delete((void *)local_70._0_8_,local_60[0] + 1);
      pcVar5 = extraout_RDX_09;
    }
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
      pcVar5 = extraout_RDX_10;
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    pcVar5 = extraout_RDX_11;
  }
  do {
    if (this_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_0020b0a3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    in_string_00._M_str = pcVar5;
    in_string_00._M_len = (size_t)__s1._M_p;
    dVar6 = jessilib::decode_codepoint_utf8<char8_t>((jessilib *)this_00,in_string_00);
    pcVar5 = (char8_t *)dVar6.units;
    if (pcVar5 == (char8_t *)0x0) {
      local_80[0] = 0;
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(char *)local_80,"is_valid(abcd_string_view)","false");
      testing::internal::AssertHelper::AssertHelper
                (local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0xa2,(char *)local_70._0_8_);
      testing::internal::AssertHelper::operator=(local_90,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(local_90);
      if ((long *)local_70._0_8_ != local_60) {
        operator_delete((void *)local_70._0_8_,local_60[0] + 1);
      }
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
      }
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78);
      }
      goto LAB_0020b0a3;
    }
    __s1._M_p = __s1._M_p + (long)pcVar5;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)this_00 - (long)pcVar5);
  } while( true );
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}